

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O1

Error __thiscall asmjit::BaseRAPass::addExitBlock(BaseRAPass *this,RABlock *block)

{
  size_type *psVar1;
  Error EVar2;
  
  *(byte *)&block->_flags = (byte)block->_flags | 0x10;
  if (((this->_exits).super_ZoneVectorBase._size != (this->_exits).super_ZoneVectorBase._capacity)
     || (EVar2 = ZoneVectorBase::_grow(&(this->_exits).super_ZoneVectorBase,&this->_allocator,8,1),
        EVar2 == 0)) {
    *(RABlock **)
     ((long)(this->_exits).super_ZoneVectorBase._data +
     (ulong)(this->_exits).super_ZoneVectorBase._size * 8) = block;
    psVar1 = &(this->_exits).super_ZoneVectorBase._size;
    *psVar1 = *psVar1 + 1;
    EVar2 = 0;
  }
  return EVar2;
}

Assistant:

inline Error addExitBlock(RABlock* block) noexcept {
    block->addFlags(RABlock::kFlagIsFuncExit);
    return _exits.append(allocator(), block);
  }